

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O3

shared_ptr<mocker::nasm::Addr> __thiscall
mocker::anon_unknown_0::FuncSelectionContext::getIrAddr
          (FuncSelectionContext *this,shared_ptr<mocker::ir::Addr> *addr)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar4;
  element_type *extraout_RAX;
  const_iterator cVar5;
  element_type *extraout_RAX_00;
  Reg *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined **ppuVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  __shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<mocker::nasm::Addr> sVar8;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> local_38;
  
  _Var7 = (__shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>)
          ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                    (&local_38,(IntLiteral *)in_RDX);
  peVar2 = local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pp_Var1 = local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              _vptr_Addr;
    peVar4 = (element_type *)operator_new(0x20);
    peVar4->val = 0x100000001;
    (peVar4->super_Addr)._vptr_Addr = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9070;
    _Var7._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Addr_001e90c0;
    _Var7._M_ptr = peVar4;
    peVar4[1].super_Addr._vptr_Addr = (_func_int **)&PTR__Addr_001e90c0;
    peVar4[1].val = (int64_t)pp_Var1;
    (this->irRegAddr).mp._M_h._M_buckets = (__buckets_ptr)(peVar4 + 1);
    (this->irRegAddr).mp._M_h._M_bucket_count = (size_type)peVar4;
  }
  if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var7._M_refcount._M_pi = extraout_RDX._M_pi;
    _Var7._M_ptr = extraout_RAX;
  }
  if (peVar2 == (element_type *)0x0) {
    ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>(&local_38,in_RDX);
    iVar3 = std::__cxx11::string::compare
                      ((char *)(local_38.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 1));
    if (iVar3 == 0) {
      peVar4 = (element_type *)operator_new(0x20);
      peVar4->val = 0x100000001;
      (peVar4->super_Addr)._vptr_Addr = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9070;
      ppuVar6 = &PTR__Addr_001e90c0;
      peVar4[1].super_Addr._vptr_Addr = (_func_int **)&PTR__Addr_001e90c0;
      peVar4[1].val = 0;
      (this->irRegAddr).mp._M_h._M_buckets = (__buckets_ptr)(peVar4 + 1);
      (this->irRegAddr).mp._M_h._M_bucket_count = (size_type)peVar4;
    }
    else {
      if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("reg",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                      ,0x45,
                      "std::shared_ptr<nasm::Addr> mocker::(anonymous namespace)::FuncSelectionContext::getIrAddr(const std::shared_ptr<ir::Addr> &) const"
                     );
      }
      cVar5 = std::
              _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)addr,(key_type *)&local_38);
      if (cVar5.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      (this->irRegAddr).mp._M_h._M_buckets =
           *(__buckets_ptr *)
            ((long)cVar5.
                   super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                   ._M_cur + 0x18);
      peVar4 = *(element_type **)
                ((long)cVar5.
                       super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                       ._M_cur + 0x20);
      (this->irRegAddr).mp._M_h._M_bucket_count = (size_type)peVar4;
      ppuVar6 = (undefined **)extraout_RDX_00;
      if (peVar4 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&peVar4->val = (int)peVar4->val + 1;
          UNLOCK();
        }
        else {
          *(int *)&peVar4->val = (int)peVar4->val + 1;
        }
      }
    }
    _Var7._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar6;
    _Var7._M_ptr = peVar4;
    if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var7._M_refcount._M_pi = extraout_RDX_01._M_pi;
      _Var7._M_ptr = extraout_RAX_00;
    }
  }
  sVar8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var7._M_ptr;
  sVar8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_refcount._M_pi;
  return (shared_ptr<mocker::nasm::Addr>)
         sVar8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<nasm::Addr>
  getIrAddr(const std::shared_ptr<ir::Addr> &addr) const {
    if (auto p = ir::dyc<ir::IntLiteral>(addr)) {
      return std::make_shared<nasm::NumericConstant>(p->getVal());
    }
    auto reg = ir::dyc<ir::Reg>(addr);
    if (reg->getIdentifier() == ".phi_nan")
      return std::make_shared<nasm::NumericConstant>(0);
    assert(reg);
    return irRegAddr.getVReg(reg);
  }